

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# split.hpp
# Opt level: O1

pair<std::__cxx11::basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>,_std::__cxx11::basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>_>
* __thiscall
jessilib::
split_once<std::__cxx11::u16string,__gnu_cxx::__normal_iterator<char16_t_const*,std::__cxx11::u16string>,__gnu_cxx::__normal_iterator<char16_t_const*,std::__cxx11::u16string>,char16_t>
          (pair<std::__cxx11::basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>,_std::__cxx11::basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>_>
           *__return_storage_ptr__,jessilib *this,
          __normal_iterator<const_char16_t_*,_std::__cxx11::basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>_>
          begin,__normal_iterator<const_char16_t_*,_std::__cxx11::basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>_>
                end,char16_t in_delim)

{
  anon_union_16_2_edb7204a_for_basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>_11
  *paVar1;
  anon_union_16_2_edb7204a_for_basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>_11
  *paVar2;
  anon_union_16_2_edb7204a_for_basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>_11
  *paVar3;
  jessilib *pjVar4;
  basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_> local_90;
  basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_> local_70;
  basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_> local_50;
  
  paVar2 = &local_90.field_2;
  local_90._M_string_length = 0;
  local_90.field_2._M_local_buf[0] = L'\0';
  paVar3 = &local_70.field_2;
  local_70._M_string_length = 0;
  local_70.field_2._M_local_buf[0] = L'\0';
  pjVar4 = this;
  if (this < begin._M_current) {
    do {
      local_90._M_dataplus._M_p = (pointer)paVar2;
      local_70._M_dataplus._M_p = (pointer)paVar3;
      if (*(char16_t *)pjVar4 == (char16_t)end._M_current) {
        local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
        std::__cxx11::u16string::
        _M_construct<__gnu_cxx::__normal_iterator<char16_t_const*,std::__cxx11::u16string>>
                  ((u16string *)&local_50,this,pjVar4);
        split_once<std::__cxx11::u16string,__gnu_cxx::__normal_iterator<char16_t_const*,std::__cxx11::u16string>,__gnu_cxx::__normal_iterator<char16_t_const*,std::__cxx11::u16string>,char16_t>
                  ();
        local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
        std::__cxx11::u16string::
        _M_construct<__gnu_cxx::__normal_iterator<char16_t_const*,std::__cxx11::u16string>>
                  ((u16string *)&local_50,pjVar4 + 2,begin._M_current);
        std::__cxx11::basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>
        ::operator=(&local_70,&local_50);
        if ((anon_union_16_2_edb7204a_for_basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>_11
             *)local_50._M_dataplus._M_p != &local_50.field_2) goto LAB_0032711b;
        goto LAB_0032712d;
      }
      pjVar4 = pjVar4 + 2;
    } while (pjVar4 != (jessilib *)begin._M_current);
    local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
    std::__cxx11::u16string::
    _M_construct<__gnu_cxx::__normal_iterator<char16_t_const*,std::__cxx11::u16string>>
              ((u16string *)&local_50,this,begin._M_current);
    std::__cxx11::basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>::
    operator=(&local_90,&local_50);
    if ((anon_union_16_2_edb7204a_for_basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>_11
         *)local_50._M_dataplus._M_p != &local_50.field_2) {
LAB_0032711b:
      operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity * 2 + 2);
    }
LAB_0032712d:
    paVar1 = &(__return_storage_ptr__->first).field_2;
    (__return_storage_ptr__->first)._M_dataplus._M_p = (pointer)paVar1;
    if ((anon_union_16_2_edb7204a_for_basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>_11
         *)local_90._M_dataplus._M_p == paVar2) {
      paVar1->_M_allocated_capacity =
           CONCAT62(local_90.field_2._M_allocated_capacity._2_6_,local_90.field_2._M_local_buf[0]);
      *(ulong *)((long)&(__return_storage_ptr__->first).field_2 + 8) =
           CONCAT26(local_90.field_2._M_local_buf[7],
                    CONCAT42(local_90.field_2._10_4_,local_90.field_2._M_local_buf[4]));
    }
    else {
      (__return_storage_ptr__->first)._M_dataplus._M_p = local_90._M_dataplus._M_p;
      (__return_storage_ptr__->first).field_2._M_allocated_capacity =
           CONCAT62(local_90.field_2._M_allocated_capacity._2_6_,local_90.field_2._M_local_buf[0]);
    }
    (__return_storage_ptr__->first)._M_string_length = local_90._M_string_length;
    paVar2 = &(__return_storage_ptr__->second).field_2;
    (__return_storage_ptr__->second)._M_dataplus._M_p = (pointer)paVar2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>_11
         *)local_70._M_dataplus._M_p == paVar3) {
      paVar2->_M_allocated_capacity =
           CONCAT62(local_70.field_2._M_allocated_capacity._2_6_,local_70.field_2._M_local_buf[0]);
      *(undefined8 *)((long)&(__return_storage_ptr__->second).field_2 + 8) = local_70.field_2._8_8_;
    }
    else {
      (__return_storage_ptr__->second)._M_dataplus._M_p = local_70._M_dataplus._M_p;
      (__return_storage_ptr__->second).field_2._M_allocated_capacity =
           CONCAT62(local_70.field_2._M_allocated_capacity._2_6_,local_70.field_2._M_local_buf[0]);
    }
  }
  else {
    (__return_storage_ptr__->first)._M_dataplus._M_p =
         (pointer)&(__return_storage_ptr__->first).field_2;
    (__return_storage_ptr__->first).field_2._M_local_buf[0] = L'\0';
    *(ulong *)((long)&(__return_storage_ptr__->first).field_2 + 2) =
         CONCAT26(local_90.field_2._M_local_buf[4],local_90.field_2._M_allocated_capacity._2_6_);
    *(undefined4 *)((long)&(__return_storage_ptr__->first).field_2 + 10) = local_90.field_2._10_4_;
    (__return_storage_ptr__->first).field_2._M_local_buf[7] = local_90.field_2._M_local_buf[7];
    local_70._M_string_length = 0;
    (__return_storage_ptr__->first)._M_string_length = 0;
    (__return_storage_ptr__->second)._M_dataplus._M_p =
         (pointer)&(__return_storage_ptr__->second).field_2;
    (__return_storage_ptr__->second).field_2._M_allocated_capacity =
         (ulong)(uint6)local_70.field_2._M_allocated_capacity._2_6_ << 0x10;
    *(undefined8 *)((long)&(__return_storage_ptr__->second).field_2 + 8) = local_70.field_2._8_8_;
  }
  (__return_storage_ptr__->second)._M_string_length = local_70._M_string_length;
  return __return_storage_ptr__;
}

Assistant:

constexpr auto split_once(ItrT begin, EndT end, ElementT in_delim) {
	static_assert(sizeof...(OptionalMemberT) <= 1, "Too many member types specified for OptionalMemberT");
	using MemberT = std::tuple_element_t<0, std::tuple<OptionalMemberT..., std::basic_string<ElementT>>>;

	std::pair<MemberT, MemberT> result;
	if (begin >= end) {
		// Nothing to split
		return result;
	}

	for (auto itr = begin; itr != end; ++itr) {
		if (*itr == in_delim) {
			// in_delim found; split upon it
			result.first = make_split_member<MemberT>(begin, itr);
			result.second = make_split_member<MemberT>(itr + 1, end);
			return result;
		}
	}

	// in_delim not found
	result.first = make_split_member<MemberT>(begin, end);
	return result;
}